

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O1

bool __thiscall FIX::SocketMonitor::drop(SocketMonitor *this,socket_handle s)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Rb_tree_header *p_Var3;
  socket_handle *psVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar9;
  socket_handle local_34;
  
  p_Var1 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_readSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < s]) {
    if (s <= (int)p_Var5[1]._M_color) {
      p_Var6 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) && (p_Var5 = p_Var6, s < (int)p_Var6[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  p_Var3 = &(this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header;
  p_Var6 = (this->m_writeSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var7 = &p_Var3->_M_header;
  for (; p_Var6 != (_Base_ptr)0x0; p_Var6 = (&p_Var6->_M_left)[(int)p_Var6[1]._M_color < s]) {
    if (s <= (int)p_Var6[1]._M_color) {
      p_Var7 = p_Var6;
    }
  }
  p_Var6 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var7 != p_Var3) && (p_Var6 = p_Var7, s < (int)p_Var7[1]._M_color)) {
    p_Var6 = &p_Var3->_M_header;
  }
  p_Var2 = &(this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header;
  p_Var7 = (this->m_connectSockets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var8 = &p_Var2->_M_header;
  for (; p_Var7 != (_Base_ptr)0x0; p_Var7 = (&p_Var7->_M_left)[(int)p_Var7[1]._M_color < s]) {
    if (s <= (int)p_Var7[1]._M_color) {
      p_Var8 = p_Var7;
    }
  }
  p_Var7 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var8 != p_Var2) && (p_Var7 = p_Var8, s < (int)p_Var8[1]._M_color)) {
    p_Var7 = &p_Var2->_M_header;
  }
  if ((_Rb_tree_header *)p_Var7 != p_Var2 ||
      ((_Rb_tree_header *)p_Var6 != p_Var3 || (_Rb_tree_header *)p_Var5 != p_Var1)) {
    local_34 = s;
    socket_close(s);
    pVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&(this->m_readSockets)._M_t,&local_34);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(this->m_readSockets)._M_t,(_Base_ptr)pVar9.first._M_node,
               (_Base_ptr)pVar9.second._M_node);
    pVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&(this->m_writeSockets)._M_t,&local_34);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(this->m_writeSockets)._M_t,(_Base_ptr)pVar9.first._M_node,
               (_Base_ptr)pVar9.second._M_node);
    pVar9 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
            equal_range(&(this->m_connectSockets)._M_t,&local_34);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_M_erase_aux
              (&(this->m_connectSockets)._M_t,(_Base_ptr)pVar9.first._M_node,
               (_Base_ptr)pVar9.second._M_node);
    psVar4 = (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (psVar4 == (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<int,std::allocator<int>>::_M_push_back_aux<int_const&>
                ((deque<int,std::allocator<int>> *)&this->m_dropped,&local_34);
    }
    else {
      *psVar4 = local_34;
      (this->m_dropped).c.super__Deque_base<int,_std::allocator<int>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = psVar4 + 1;
    }
  }
  return (_Rb_tree_header *)p_Var7 != p_Var2 ||
         ((_Rb_tree_header *)p_Var6 != p_Var3 || (_Rb_tree_header *)p_Var5 != p_Var1);
}

Assistant:

bool SocketMonitor::drop(socket_handle s) {
  Sockets::iterator i = m_readSockets.find(s);
  Sockets::iterator j = m_writeSockets.find(s);
  Sockets::iterator k = m_connectSockets.find(s);

  if (i != m_readSockets.end() || j != m_writeSockets.end() || k != m_connectSockets.end()) {
    socket_close(s);
    m_readSockets.erase(s);
    m_writeSockets.erase(s);
    m_connectSockets.erase(s);
    m_dropped.push(s);
    return true;
  }
  return false;
}